

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-options.c
# Opt level: O3

wchar_t cmp_ignore(void *a,void *b)

{
  wchar_t wVar1;
  char bufb [80];
  char bufa [80];
  char acStack_b8 [80];
  char local_68 [88];
  
  if (*(_Bool *)((long)a + 8) == false) {
    if (*(char *)((long)b + 8) != '\0') {
      return L'\x01';
    }
  }
  else if (*(char *)((long)b + 8) == '\0') {
    return L'\xffffffff';
  }
  object_kind_name(local_68,0x50,*a,*(_Bool *)((long)a + 8));
  object_kind_name(acStack_b8,0x50,*b,*(_Bool *)((long)b + 8));
  wVar1 = strcmp(local_68,acStack_b8);
  return wVar1;
}

Assistant:

static int cmp_ignore(const void *a, const void *b)
{
	char bufa[80];
	char bufb[80];
	const ignore_choice *x = a;
	const ignore_choice *y = b;

	if (!x->aware && y->aware)
		return 1;
	if (x->aware && !y->aware)
		return -1;

	object_kind_name(bufa, sizeof(bufa), x->kind, x->aware);
	object_kind_name(bufb, sizeof(bufb), y->kind, y->aware);

	return strcmp(bufa, bufb);
}